

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

int __thiscall
skiplist<DictKey,_std::less<DictKey>_>::count
          (skiplist<DictKey,_std::less<DictKey>_> *this,DictKey *value)

{
  int iVar1;
  iterator it;
  iterator local_50;
  undefined1 local_38 [40];
  
  DictKey::DictKey((DictKey *)local_38,value);
  find(&local_50,this,(DictKey *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  if ((local_50.node != (SLNode<DictKey> *)0x0) || (iVar1 = 0, local_50.node_count_ != 0)) {
    iVar1 = (local_50.node)->count;
  }
  return iVar1;
}

Assistant:

int count(val_type value) {
        auto it = find(value);
        return  it != end() ? it.node->count : 0;
    }